

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O0

void __thiscall ArrayType::~ArrayType(ArrayType *this)

{
  void *in_RDI;
  ArrayType *in_stack_00000020;
  
  ~ArrayType(in_stack_00000020);
  operator_delete(in_RDI,0x248);
  return;
}

Assistant:

ArrayType::~ArrayType()
	{
	delete arraylength_var_field_;
	delete elem_it_var_field_;
	delete elem_var_field_;
	delete elem_dataptr_var_field_;
	delete elem_input_var_field_;

	delete elem_dataptr_until_expr_;
	}